

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_64bits_digest(XXH3_state_t *state)

{
  void *secret_00;
  long in_RDI;
  uchar *unaff_retaddr;
  XXH3_state_t *in_stack_00000008;
  XXH64_hash_t acc [8];
  uchar *secret;
  size_t in_stack_ffffffffffffff98;
  xxh_u8 *in_stack_ffffffffffffffa8;
  xxh_u64 *in_stack_ffffffffffffffb0;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x238) == 0) {
    secret_00 = (void *)(in_RDI + 0x40);
  }
  else {
    secret_00 = *(void **)(in_RDI + 0x238);
  }
  if (*(ulong *)(in_RDI + 0x210) < 0xf1) {
    if (*(long *)(in_RDI + 0x228) == 0) {
      local_8 = XXH3_64bits_withSecret
                          (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,secret_00,
                           in_stack_ffffffffffffff98);
    }
    else {
      local_8 = XXH3_64bits_withSeed(secret_00,in_stack_ffffffffffffff98,0x1420c2);
    }
  }
  else {
    XXH3_digest_long((XXH64_hash_t *)acc[0],in_stack_00000008,unaff_retaddr);
    local_8 = XXH3_mergeAccs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(xxh_u64)secret_00)
    ;
  }
  return local_8;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH3_64bits_digest (const XXH3_state_t* state)
{
    const unsigned char* const secret = (state->extSecret == NULL) ? state->customSecret : state->extSecret;
    if (state->totalLen > XXH3_MIDSIZE_MAX) {
        XXH_ALIGN(XXH_ACC_ALIGN) XXH64_hash_t acc[XXH_ACC_NB];
        XXH3_digest_long(acc, state, secret);
        return XXH3_mergeAccs(acc,
                              secret + XXH_SECRET_MERGEACCS_START,
                              (xxh_u64)state->totalLen * XXH_PRIME64_1);
    }
    /* totalLen <= XXH3_MIDSIZE_MAX: digesting a short input */
    if (state->seed)
        return XXH3_64bits_withSeed(state->buffer, (size_t)state->totalLen, state->seed);
    return XXH3_64bits_withSecret(state->buffer, (size_t)(state->totalLen),
                                  secret, state->secretLimit + XXH_STRIPE_LEN);
}